

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetFields
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UBool param_3,int32_t *parsedLen)

{
  int32_t iVar1;
  int32_t iVar2;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  int32_t offsetS;
  int32_t offsetM;
  int32_t offsetH;
  uint local_48;
  int32_t tmpS;
  int32_t tmpM;
  int32_t tmpH;
  int32_t *local_38;
  
  lVar4 = 0;
  *parsedLen = 0;
  offsetS = 0;
  offsetM = 0;
  offsetH = 0;
  puVar5 = &PARSE_GMT_OFFSET_TYPES;
  local_38 = parsedLen;
  while (iVar1 = parseOffsetFieldsWithPattern
                           (this,text,start,this->fGMTOffsetPatternItems[*puVar5],'\0',&offsetH,
                            &offsetM,&offsetS), iVar1 < 1) {
    lVar4 = lVar4 + -1;
    puVar5 = puVar5 + 1;
    if (lVar4 == -6) {
      return 0;
    }
  }
  local_48 = 1;
  if (((int)lVar4 != -2) && ((int)lVar4 != -4)) {
    local_48 = -(uint)(lVar4 != 0) | 1;
  }
  if (this->fAbuttingOffsetHoursAndMinutes != '\0') {
    lVar4 = 0;
    tmpH = 0;
    tmpM = 0;
    tmpS = 0;
    puVar5 = &PARSE_GMT_OFFSET_TYPES;
    do {
      iVar2 = parseOffsetFieldsWithPattern
                        (this,text,start,this->fGMTOffsetPatternItems[*puVar5],'\x01',&tmpH,&tmpM,
                         &tmpS);
      if (0 < iVar2) {
        uVar3 = 1;
        if (((int)lVar4 != -2) && ((int)lVar4 != -4)) {
          uVar3 = -(uint)(lVar4 != 0) | 1;
        }
        goto LAB_002002b7;
      }
      lVar4 = lVar4 + -1;
      puVar5 = puVar5 + 1;
    } while (lVar4 != -6);
    uVar3 = 1;
LAB_002002b7:
    if (iVar1 < iVar2) {
      offsetH = tmpH;
      offsetM = tmpM;
      offsetS = tmpS;
      iVar1 = iVar2;
      local_48 = uVar3;
    }
    if (iVar1 < 1) {
      return 0;
    }
  }
  *local_38 = iVar1;
  return ((offsetH * 0x3c + offsetM) * 0x3c + offsetS) * local_48 * 1000;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetFields(const UnicodeString& text, int32_t start, UBool /*isShort*/, int32_t& parsedLen) const {
    int32_t outLen = 0;
    int32_t offset = 0;
    int32_t sign = 1;

    parsedLen = 0;

    int32_t offsetH, offsetM, offsetS;
    offsetH = offsetM = offsetS = 0;

    for (int32_t patidx = 0; PARSE_GMT_OFFSET_TYPES[patidx] >= 0; patidx++) {
        int32_t gmtPatType = PARSE_GMT_OFFSET_TYPES[patidx];
        UVector* items = fGMTOffsetPatternItems[gmtPatType];
        U_ASSERT(items != NULL);

        outLen = parseOffsetFieldsWithPattern(text, start, items, FALSE, offsetH, offsetM, offsetS);
        if (outLen > 0) {
            sign = (gmtPatType == UTZFMT_PAT_POSITIVE_H || gmtPatType == UTZFMT_PAT_POSITIVE_HM || gmtPatType == UTZFMT_PAT_POSITIVE_HMS) ?
                1 : -1;
            break;
        }
    }

    if (outLen > 0 && fAbuttingOffsetHoursAndMinutes) {
        // When hours field is sabutting minutes field,
        // the parse result above may not be appropriate.
        // For example, "01020" is parsed as 01:02: above,
        // but it should be parsed as 00:10:20.
        int32_t tmpLen = 0;
        int32_t tmpSign = 1;
        int32_t tmpH = 0;
        int32_t tmpM = 0;
        int32_t tmpS = 0;

        for (int32_t patidx = 0; PARSE_GMT_OFFSET_TYPES[patidx] >= 0; patidx++) {
            int32_t gmtPatType = PARSE_GMT_OFFSET_TYPES[patidx];
            UVector* items = fGMTOffsetPatternItems[gmtPatType];
            U_ASSERT(items != NULL);

            // forcing parse to use single hour digit
            tmpLen = parseOffsetFieldsWithPattern(text, start, items, TRUE, tmpH, tmpM, tmpS);
            if (tmpLen > 0) {
                tmpSign = (gmtPatType == UTZFMT_PAT_POSITIVE_H || gmtPatType == UTZFMT_PAT_POSITIVE_HM || gmtPatType == UTZFMT_PAT_POSITIVE_HMS) ?
                    1 : -1;
                break;
            }
        }
        if (tmpLen > outLen) {
            // Better parse result with single hour digit
            outLen = tmpLen;
            sign = tmpSign;
            offsetH = tmpH;
            offsetM = tmpM;
            offsetS = tmpS;
        }
    }

    if (outLen > 0) {
        offset = ((((offsetH * 60) + offsetM) * 60) + offsetS) * 1000 * sign;
        parsedLen = outLen;
    }

    return offset;
}